

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O1

void __thiscall rw::MatFX::getUVTransformMatrices(MatFX *this,Matrix **base,Matrix **dual)

{
  int i;
  ulong uVar1;
  Texture *pTVar2;
  MatFX *pMVar3;
  
  uVar1 = 0;
  pMVar3 = this;
  do {
    if (pMVar3->fx[0].type == 5) goto LAB_0012f6cc;
    uVar1 = uVar1 + 1;
    pMVar3 = (MatFX *)(pMVar3->fx + 1);
  } while (uVar1 == 1);
  uVar1 = 0xffffffff;
LAB_0012f6cc:
  if ((int)uVar1 < 0) {
    if (base != (Matrix **)0x0) {
      *base = (Matrix *)0x0;
    }
    if (dual == (Matrix **)0x0) {
      return;
    }
    pTVar2 = (Texture *)0x0;
  }
  else {
    if (base != (Matrix **)0x0) {
      *base = (Matrix *)this->fx[uVar1 & 0xffffffff].field_1.bump.frame;
    }
    if (dual == (Matrix **)0x0) {
      return;
    }
    pTVar2 = this->fx[uVar1 & 0xffffffff].field_1.bump.bumpedTex;
  }
  *dual = (Matrix *)pTVar2;
  return;
}

Assistant:

void
MatFX::getUVTransformMatrices(Matrix **base, Matrix **dual)
{
	int32 i = this->getEffectIndex(UVTRANSFORM);
	if(i >= 0){
		if(base) *base = this->fx[i].uvtransform.baseTransform;
		if(dual) *dual = this->fx[i].uvtransform.dualTransform;
		return;
	}
	if(base) *base = nil;
	if(dual) *dual = nil;
}